

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall
LinearScan::AvoidCompensationConflicts
          (LinearScan *this,LabelInstr *labelInstr,BranchInstr *branchInstr,
          Lifetime **labelRegContent,Lifetime **branchRegContent,Instr **pInsertionInstr,
          Instr **pInsertionStartInstr,bool needsAirlock,bool *pHasAirlock)

{
  IRType type;
  RegNum reg;
  Lifetime *pLVar1;
  RegNum RVar2;
  bool bVar3;
  bool bVar4;
  uint32 number;
  RegOpnd *dstOpnd;
  RegOpnd *src2Opnd;
  Instr *instr;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  LabelInstr *pLVar9;
  ulong uVar10;
  RegNum aRStack_98 [8];
  RegNum conflictRegs [33];
  
  unique0x100002c5 = branchInstr;
  do {
    conflictRegs[8] = RegNOREG;
    conflictRegs[9] = RegNOREG;
    conflictRegs[10] = RegNOREG;
    conflictRegs[0xb] = RegNOREG;
    conflictRegs[0xc] = RegNOREG;
    conflictRegs[0xd] = RegNOREG;
    conflictRegs[0xe] = RegNOREG;
    conflictRegs[0xf] = RegNOREG;
    conflictRegs[0x10] = RegNOREG;
    conflictRegs[0x11] = RegNOREG;
    conflictRegs[0x12] = RegNOREG;
    conflictRegs[0x13] = RegNOREG;
    conflictRegs[0x14] = RegNOREG;
    conflictRegs[0x15] = RegNOREG;
    conflictRegs[0x16] = RegNOREG;
    conflictRegs[0x17] = RegNOREG;
    aRStack_98[0] = RegNOREG;
    aRStack_98[1] = RegNOREG;
    aRStack_98[2] = RegNOREG;
    aRStack_98[3] = RegNOREG;
    aRStack_98[4] = RegNOREG;
    aRStack_98[5] = RegNOREG;
    aRStack_98[6] = RegNOREG;
    aRStack_98[7] = RegNOREG;
    conflictRegs[0] = RegNOREG;
    conflictRegs[1] = RegNOREG;
    conflictRegs[2] = RegNOREG;
    conflictRegs[3] = RegNOREG;
    conflictRegs[4] = RegNOREG;
    conflictRegs[5] = RegNOREG;
    conflictRegs[6] = RegNOREG;
    conflictRegs[7] = RegNOREG;
    conflictRegs[0x18] = RegNOREG;
    uVar10 = (this->secondChanceRegs).word;
    if (uVar10 == 0) {
      return;
    }
    uVar7 = 0;
    if (uVar10 != 0) {
      for (; (uVar10 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
      }
    }
    bVar3 = false;
    do {
      BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar7);
      pLVar1 = branchRegContent[uVar7];
      if (pLVar1 != labelRegContent[uVar7]) {
        type = RegTypes[uVar7];
        bVar4 = IRType_IsFloat(type);
        if ((!bVar4) && (bVar4 = NeedsLoopBackEdgeCompensation(this,pLVar1,labelInstr), bVar4)) {
          pLVar9 = (LabelInstr *)*pInsertionInstr;
          if ((needsAirlock) && (*pHasAirlock == false)) {
            InsertAirlock(this,stack0xffffffffffffff90,labelInstr);
            *pInsertionStartInstr = (labelInstr->super_Instr).m_prev;
            *pHasAirlock = true;
            pLVar9 = labelInstr;
          }
          *pInsertionInstr = &pLVar9->super_Instr;
          reg = conflictRegs[uVar7 - 8];
          uVar8 = (ulong)reg;
          uVar5 = uVar7;
          RVar2 = (RegNum)uVar7;
          if (uVar8 != 0) {
            dstOpnd = IR::RegOpnd::New(branchRegContent[uVar7]->sym,(RegNum)uVar7,type,this->func);
            src2Opnd = IR::RegOpnd::New(branchRegContent[uVar7]->sym,reg,type,this->func);
            instr = IR::Instr::New(XCHG,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,
                                   &src2Opnd->super_Opnd,this->func);
            IR::Instr::InsertBefore(*pInsertionInstr,instr);
            number = IR::Instr::GetNumber(*pInsertionInstr);
            IR::Instr::SetNumber(instr,number);
            pLVar1 = branchRegContent[uVar7];
            branchRegContent[uVar7] = branchRegContent[uVar8];
            branchRegContent[uVar8] = pLVar1;
            bVar3 = true;
            uVar5 = uVar8;
            RVar2 = reg;
          }
          lVar6 = 0;
          do {
            if (labelRegContent[lVar6 + 1] == branchRegContent[uVar5]) {
              conflictRegs[lVar6 + -7] = RVar2;
              break;
            }
            lVar6 = lVar6 + 1;
          } while ((char)lVar6 != '\x10');
        }
      }
      uVar10 = uVar10 & ~(1L << (uVar7 & 0x3f));
      uVar7 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
        }
      }
    } while (uVar10 != 0);
    if (!bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void LinearScan::AvoidCompensationConflicts(IR::LabelInstr *labelInstr, IR::BranchInstr *branchInstr,
                                            Lifetime *labelRegContent[], Lifetime *branchRegContent[],
                                            IR::Instr **pInsertionInstr, IR::Instr **pInsertionStartInstr, bool needsAirlock, bool *pHasAirlock)
{
    bool changed = true;

    // Look for conflicts in the incoming compensation code:
    //      MOV     ESI, EAX
    //      MOV     ECX, ESI    <<  ESI was lost...
    // Using XCHG:
    //      XCHG    ESI, EAX
    //      MOV     ECX, EAX
    //
    // Note that we need to iterate while(changed) to catch all conflicts
    while(changed) {
        RegNum conflictRegs[RegNumCount] = {RegNOREG};
        changed = false;

        FOREACH_BITSET_IN_UNITBV(reg, this->secondChanceRegs, BitVector)
        {
            Lifetime *labelLifetime = labelRegContent[reg];
            Lifetime *lifetime = branchRegContent[reg];

            // We don't have an XCHG for SSE2 regs
            if (lifetime == labelLifetime || IRType_IsFloat(RegTypes[reg]))
            {
                continue;
            }

            if (this->NeedsLoopBackEdgeCompensation(lifetime, labelInstr))
            {
                // Mismatch, we need to insert compensation code
                *pInsertionInstr = this->EnsureAirlock(needsAirlock, pHasAirlock, *pInsertionInstr, pInsertionStartInstr, branchInstr, labelInstr);

                if (conflictRegs[reg] != RegNOREG)
                {
                    // Eliminate conflict with an XCHG
                    IR::RegOpnd *reg1 = IR::RegOpnd::New(branchRegContent[reg]->sym, (RegNum)reg, RegTypes[reg], this->func);
                    IR::RegOpnd *reg2 = IR::RegOpnd::New(branchRegContent[reg]->sym, conflictRegs[reg], RegTypes[reg], this->func);
                    IR::Instr *instrXchg = IR::Instr::New(Js::OpCode::XCHG, reg1, reg1, reg2, this->func);
                    (*pInsertionInstr)->InsertBefore(instrXchg);
                    instrXchg->CopyNumber(*pInsertionInstr);

                    Lifetime *tmpLifetime = branchRegContent[reg];
                    branchRegContent[reg] = branchRegContent[conflictRegs[reg]];
                    branchRegContent[conflictRegs[reg]] = tmpLifetime;
                    reg = conflictRegs[reg];

                    changed = true;
                }
                RegNum labelReg = RegNOREG;
                FOREACH_INT_REG(regIter)
                {
                    if (labelRegContent[regIter] == branchRegContent[reg])
                    {
                        labelReg = regIter;
                        break;
                    }
                } NEXT_INT_REG;

                if (labelReg != RegNOREG)
                {
                    conflictRegs[labelReg] = (RegNum)reg;
                }
            }
        } NEXT_BITSET_IN_UNITBV;
    }
}